

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O2

ssize_t __thiscall
duckdb_parquet::SchemaElement::read(SchemaElement *this,int __fd,void *__buf,size_t __nbytes)

{
  undefined1 *puVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ssize_t sVar6;
  undefined8 *puVar7;
  int16_t *__nbytes_00;
  void *__buf_00;
  undefined4 in_register_00000034;
  TProtocol *this_00;
  int32_t ecast54;
  int16_t fid;
  uint local_90;
  TType ftype;
  int32_t *local_88;
  string *local_80;
  int32_t *local_78;
  int32_t *local_70;
  int32_t *local_68;
  int32_t *local_60;
  LogicalType *local_58;
  string fname;
  
  this_00 = (TProtocol *)CONCAT44(in_register_00000034,__fd);
  duckdb_apache::thrift::protocol::TProtocol::incrementInputRecursionDepth(this_00);
  fname._M_dataplus._M_p = (pointer)&fname.field_2;
  fname._M_string_length = 0;
  fname.field_2._M_local_buf[0] = '\0';
  iVar2 = (*this_00->_vptr_TProtocol[0x19])(this_00,&fname);
  local_58 = &this->logicalType;
  local_60 = &this->field_id;
  local_68 = &this->precision;
  local_70 = &this->scale;
  local_78 = &this->num_children;
  local_80 = &this->name;
  local_88 = &this->type_length;
  local_90 = 0;
  do {
    __nbytes_00 = &fid;
    iVar3 = (*this_00->_vptr_TProtocol[0x1b])(this_00,&fname,&ftype);
    if (ftype == T_STOP) {
      iVar4 = (*this_00->_vptr_TProtocol[0x1a])(this_00);
      if ((local_90 & 1) == 0) {
        puVar7 = (undefined8 *)__cxa_allocate_exception(0x30);
        puVar7[1] = puVar7 + 3;
        puVar7[2] = 0;
        *(undefined1 *)(puVar7 + 3) = 0;
        *puVar7 = &PTR__TException_017b3280;
        *(undefined4 *)(puVar7 + 5) = 1;
        __cxa_throw(puVar7,&duckdb_apache::thrift::protocol::TProtocolException::typeinfo,
                    duckdb_apache::thrift::TException::~TException);
      }
      std::__cxx11::string::~string((string *)&fname);
      this_00->input_recursion_depth_ = this_00->input_recursion_depth_ - 1;
      return (ulong)(uint)(iVar4 + iVar3 + iVar2);
    }
    switch(fid) {
    case 1:
      if (ftype != T_I32) break;
      iVar4 = (*this_00->_vptr_TProtocol[0x27])(this_00,&ecast54);
      this->type = ecast54;
      *(byte *)&this->__isset = *(byte *)&this->__isset | 1;
      goto LAB_00da8bac;
    case 2:
      if (ftype == T_I32) {
        iVar4 = (*this_00->_vptr_TProtocol[0x27])(this_00,local_88);
        *(byte *)&this->__isset = *(byte *)&this->__isset | 2;
        goto LAB_00da8bac;
      }
      break;
    case 3:
      if (ftype == T_I32) {
        iVar4 = (*this_00->_vptr_TProtocol[0x27])(this_00,&ecast54);
        this->repetition_type = ecast54;
        *(byte *)&this->__isset = *(byte *)&this->__isset | 4;
        goto LAB_00da8bac;
      }
      break;
    case 4:
      if (ftype == T_STRING) {
        iVar4 = (*this_00->_vptr_TProtocol[0x2a])(this_00,local_80);
        local_90 = (uint)CONCAT71((uint7)(uint3)((uint)iVar4 >> 8),1);
        goto LAB_00da8bac;
      }
      break;
    case 5:
      if (ftype == T_I32) {
        iVar4 = (*this_00->_vptr_TProtocol[0x27])(this_00,local_78);
        *(byte *)&this->__isset = *(byte *)&this->__isset | 8;
        goto LAB_00da8bac;
      }
      break;
    case 6:
      if (ftype == T_I32) {
        iVar4 = (*this_00->_vptr_TProtocol[0x27])(this_00,&ecast54);
        this->converted_type = ecast54;
        *(byte *)&this->__isset = *(byte *)&this->__isset | 0x10;
        goto LAB_00da8bac;
      }
      break;
    case 7:
      if (ftype == T_I32) {
        iVar4 = (*this_00->_vptr_TProtocol[0x27])(this_00,local_70);
        *(byte *)&this->__isset = *(byte *)&this->__isset | 0x20;
        goto LAB_00da8bac;
      }
      break;
    case 8:
      if (ftype == T_I32) {
        iVar4 = (*this_00->_vptr_TProtocol[0x27])(this_00,local_68);
        *(byte *)&this->__isset = *(byte *)&this->__isset | 0x40;
        goto LAB_00da8bac;
      }
      break;
    case 9:
      if (ftype == T_I32) {
        iVar4 = (*this_00->_vptr_TProtocol[0x27])(this_00,local_60);
        *(byte *)&this->__isset = *(byte *)&this->__isset | 0x80;
        goto LAB_00da8bac;
      }
      break;
    case 10:
      if (ftype == T_STRUCT) {
        sVar6 = LogicalType::read(local_58,__fd,__buf_00,(size_t)__nbytes_00);
        iVar4 = (int)sVar6;
        puVar1 = &(this->__isset).field_0x1;
        *puVar1 = *puVar1 | 1;
        goto LAB_00da8bac;
      }
    }
    iVar4 = (*this_00->_vptr_TProtocol[0x2c])(this_00);
LAB_00da8bac:
    iVar5 = (*this_00->_vptr_TProtocol[0x1c])(this_00);
    iVar2 = iVar4 + iVar3 + iVar2 + iVar5;
  } while( true );
}

Assistant:

uint32_t SchemaElement::read(::apache::thrift::protocol::TProtocol* iprot) {

  ::apache::thrift::protocol::TInputRecursionTracker tracker(*iprot);
  uint32_t xfer = 0;
  std::string fname;
  ::apache::thrift::protocol::TType ftype;
  int16_t fid;

  xfer += iprot->readStructBegin(fname);

  using ::apache::thrift::protocol::TProtocolException;

  bool isset_name = false;

  while (true)
  {
    xfer += iprot->readFieldBegin(fname, ftype, fid);
    if (ftype == ::apache::thrift::protocol::T_STOP) {
      break;
    }
    switch (fid)
    {
      case 1:
        if (ftype == ::apache::thrift::protocol::T_I32) {
          int32_t ecast54;
          xfer += iprot->readI32(ecast54);
          this->type = static_cast<Type::type>(ecast54);
          this->__isset.type = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 2:
        if (ftype == ::apache::thrift::protocol::T_I32) {
          xfer += iprot->readI32(this->type_length);
          this->__isset.type_length = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 3:
        if (ftype == ::apache::thrift::protocol::T_I32) {
          int32_t ecast55;
          xfer += iprot->readI32(ecast55);
          this->repetition_type = static_cast<FieldRepetitionType::type>(ecast55);
          this->__isset.repetition_type = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 4:
        if (ftype == ::apache::thrift::protocol::T_STRING) {
          xfer += iprot->readString(this->name);
          isset_name = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 5:
        if (ftype == ::apache::thrift::protocol::T_I32) {
          xfer += iprot->readI32(this->num_children);
          this->__isset.num_children = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 6:
        if (ftype == ::apache::thrift::protocol::T_I32) {
          int32_t ecast56;
          xfer += iprot->readI32(ecast56);
          this->converted_type = static_cast<ConvertedType::type>(ecast56);
          this->__isset.converted_type = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 7:
        if (ftype == ::apache::thrift::protocol::T_I32) {
          xfer += iprot->readI32(this->scale);
          this->__isset.scale = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 8:
        if (ftype == ::apache::thrift::protocol::T_I32) {
          xfer += iprot->readI32(this->precision);
          this->__isset.precision = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 9:
        if (ftype == ::apache::thrift::protocol::T_I32) {
          xfer += iprot->readI32(this->field_id);
          this->__isset.field_id = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 10:
        if (ftype == ::apache::thrift::protocol::T_STRUCT) {
          xfer += this->logicalType.read(iprot);
          this->__isset.logicalType = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      default:
        xfer += iprot->skip(ftype);
        break;
    }
    xfer += iprot->readFieldEnd();
  }

  xfer += iprot->readStructEnd();

  if (!isset_name)
    throw TProtocolException(TProtocolException::INVALID_DATA);
  return xfer;
}